

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktQueryPoolStatisticsTests.cpp
# Opt level: O0

SharedPtr<vkt::Draw::Buffer> __thiscall
vkt::QueryPool::anon_unknown_0::GraphicBasicTestInstance::creatAndFillVertexBuffer
          (GraphicBasicTestInstance *this)

{
  VkDeviceSize VVar1;
  VkDevice pVVar2;
  size_type sVar3;
  VkPhysicalDeviceProperties *pVVar4;
  Allocator *allocator;
  Buffer *pBVar5;
  void *dst;
  const_reference src;
  VkDeviceSize offset;
  SharedPtrStateBase *extraout_RDX;
  long in_RSI;
  SharedPtr<vkt::Draw::Buffer> SVar6;
  Allocation local_108;
  Allocation local_e8;
  VkDeviceMemory local_c8;
  Allocation local_c0;
  void *local_a0;
  deUint8 *ptr;
  BufferCreateInfo local_88;
  undefined1 local_31;
  size_t local_30;
  VkDeviceSize dataSize;
  VkDevice device;
  DeviceInterface *vk;
  GraphicBasicTestInstance *this_local;
  SharedPtr<vkt::Draw::Buffer> *vertexBuffer;
  
  this_local = this;
  device = (VkDevice)Context::getDeviceInterface(*(Context **)(in_RSI + 8));
  dataSize = (VkDeviceSize)Context::getDevice(*(Context **)(in_RSI + 8));
  sVar3 = std::
          vector<vkt::QueryPool::(anonymous_namespace)::GraphicBasicTestInstance::VertexData,_std::allocator<vkt::QueryPool::(anonymous_namespace)::GraphicBasicTestInstance::VertexData>_>
          ::size(*(vector<vkt::QueryPool::(anonymous_namespace)::GraphicBasicTestInstance::VertexData,_std::allocator<vkt::QueryPool::(anonymous_namespace)::GraphicBasicTestInstance::VertexData>_>
                   **)(in_RSI + 0xf8));
  pVVar4 = Context::getDeviceProperties(*(Context **)(in_RSI + 8));
  local_30 = deAlignSize(sVar3 << 5,(pVVar4->limits).nonCoherentAtomSize);
  pVVar2 = device;
  VVar1 = dataSize;
  local_31 = 0;
  Draw::BufferCreateInfo::BufferCreateInfo
            (&local_88,local_30,0x80,VK_SHARING_MODE_EXCLUSIVE,0,(deUint32 *)0x0,0);
  allocator = Context::getDefaultAllocator(*(Context **)(in_RSI + 8));
  ptr._0_4_ = ::vk::MemoryRequirement::HostVisible.m_flags;
  Draw::Buffer::createAndAlloc
            ((Buffer *)this,(DeviceInterface *)pVVar2,(VkDevice)VVar1,
             &local_88.super_VkBufferCreateInfo,allocator,::vk::MemoryRequirement::HostVisible);
  Draw::BufferCreateInfo::~BufferCreateInfo(&local_88);
  pBVar5 = de::SharedPtr<vkt::Draw::Buffer>::operator->((SharedPtr<vkt::Draw::Buffer> *)this);
  Draw::Buffer::getBoundMemory(&local_c0,pBVar5);
  dst = ::vk::Allocation::getHostPtr(&local_c0);
  ::vk::Allocation::~Allocation(&local_c0);
  local_a0 = dst;
  src = std::
        vector<vkt::QueryPool::(anonymous_namespace)::GraphicBasicTestInstance::VertexData,_std::allocator<vkt::QueryPool::(anonymous_namespace)::GraphicBasicTestInstance::VertexData>_>
        ::operator[](*(vector<vkt::QueryPool::(anonymous_namespace)::GraphicBasicTestInstance::VertexData,_std::allocator<vkt::QueryPool::(anonymous_namespace)::GraphicBasicTestInstance::VertexData>_>
                       **)(in_RSI + 0xf8),0);
  sVar3 = std::
          vector<vkt::QueryPool::(anonymous_namespace)::GraphicBasicTestInstance::VertexData,_std::allocator<vkt::QueryPool::(anonymous_namespace)::GraphicBasicTestInstance::VertexData>_>
          ::size(*(vector<vkt::QueryPool::(anonymous_namespace)::GraphicBasicTestInstance::VertexData,_std::allocator<vkt::QueryPool::(anonymous_namespace)::GraphicBasicTestInstance::VertexData>_>
                   **)(in_RSI + 0xf8));
  ::deMemcpy(dst,src,sVar3 << 5);
  pVVar2 = device;
  VVar1 = dataSize;
  pBVar5 = de::SharedPtr<vkt::Draw::Buffer>::operator->((SharedPtr<vkt::Draw::Buffer> *)this);
  Draw::Buffer::getBoundMemory(&local_e8,pBVar5);
  local_c8 = ::vk::Allocation::getMemory(&local_e8);
  pBVar5 = de::SharedPtr<vkt::Draw::Buffer>::operator->((SharedPtr<vkt::Draw::Buffer> *)this);
  Draw::Buffer::getBoundMemory(&local_108,pBVar5);
  offset = ::vk::Allocation::getOffset(&local_108);
  ::vk::flushMappedMemoryRange((DeviceInterface *)pVVar2,(VkDevice)VVar1,local_c8,offset,local_30);
  ::vk::Allocation::~Allocation(&local_108);
  ::vk::Allocation::~Allocation(&local_e8);
  SVar6.m_state = extraout_RDX;
  SVar6.m_ptr = (Buffer *)this;
  return SVar6;
}

Assistant:

de::SharedPtr<Buffer> GraphicBasicTestInstance::creatAndFillVertexBuffer (void)
{
	const DeviceInterface&		vk				= m_context.getDeviceInterface();
	const VkDevice				device			= m_context.getDevice();

	const VkDeviceSize			dataSize		= static_cast<VkDeviceSize>(deAlignSize(static_cast<size_t>( m_data.size() * sizeof(VertexData)),
		static_cast<size_t>(m_context.getDeviceProperties().limits.nonCoherentAtomSize)));

	de::SharedPtr<Buffer>		vertexBuffer	= Buffer::createAndAlloc(vk, device, BufferCreateInfo(dataSize,
		VK_BUFFER_USAGE_VERTEX_BUFFER_BIT), m_context.getDefaultAllocator(), MemoryRequirement::HostVisible);

	deUint8*					ptr				= reinterpret_cast<deUint8*>(vertexBuffer->getBoundMemory().getHostPtr());
	deMemcpy(ptr, &m_data[0], static_cast<size_t>( m_data.size() * sizeof(VertexData)));

	flushMappedMemoryRange(vk, device, vertexBuffer->getBoundMemory().getMemory(), vertexBuffer->getBoundMemory().getOffset(), dataSize);
	return vertexBuffer;
}